

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iaf_psc_alpha.cpp
# Opt level: O0

double __thiscall
iaf_psc_alpha::propagator_32(iaf_psc_alpha *this,double tau_syn,double tau,double C,double h)

{
  int in_EDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double de32;
  double P32;
  double P32_singular;
  double P32_linear;
  double local_8;
  
  exp(-in_XMM3_Qa / in_XMM1_Qa);
  dVar1 = exp(-in_XMM3_Qa / in_XMM1_Qa);
  dVar2 = exp(-in_XMM3_Qa / in_XMM0_Qa);
  local_8 = expm1(in_XMM3_Qa * (1.0 / in_XMM0_Qa - 1.0 / in_XMM1_Qa));
  local_8 = (-in_XMM1_Qa / (in_XMM2_Qa * (1.0 - in_XMM1_Qa / in_XMM0_Qa))) * dVar2 * local_8;
  std::abs(in_EDI);
  if (((in_XMM1_Qa == in_XMM0_Qa) && (!NAN(in_XMM1_Qa) && !NAN(in_XMM0_Qa))) ||
     ((std::abs(in_EDI), extraout_XMM0_Qa_00 < 0.1 &&
      (std::abs(in_EDI), extraout_XMM0_Qa_01 * 2.0 < extraout_XMM0_Qa)))) {
    local_8 = (in_XMM3_Qa / in_XMM2_Qa) * dVar1;
  }
  return local_8;
}

Assistant:

double iaf_psc_alpha::propagator_32( double tau_syn, double tau, double C, double h )
{
  const double P32_linear = 1 / ( 2. * C * tau * tau ) * h * h * ( tau_syn - tau ) * std::exp( -h / tau );
  const double P32_singular = h / C * std::exp( -h / tau );
  const double P32 =
    -tau / ( C * ( 1 - tau / tau_syn ) ) * std::exp( -h / tau_syn ) * std::expm1( h * ( 1 / tau_syn - 1 / tau ) );

  const double de32 = std::abs( P32 - P32_singular );

  if ( tau == tau_syn or ( std::abs( tau - tau_syn ) < 0.1 and de32 > 2 * std::abs( P32_linear ) ) )
  {
    return P32_singular;
  }
  else
  {
    return P32;
  }
}